

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_key.cpp
# Opt level: O2

ExtkeyVersionPair __thiscall
cfd::core::KeyFormatData::GetVersionPair(KeyFormatData *this,Bip32FormatType format_type)

{
  CfdException *this_00;
  allocator local_39;
  string local_38;
  
  if (format_type < (kBip84|kBip49)) {
    return (&this->bip32_)[format_type];
  }
  this_00 = (CfdException *)__cxa_allocate_exception(0x30);
  ::std::__cxx11::string::string((string *)&local_38,"unknown format type.",&local_39);
  CfdException::CfdException(this_00,kCfdOutOfRangeError,&local_38);
  __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

ExtkeyVersionPair KeyFormatData::GetVersionPair(
    Bip32FormatType format_type) const {
  switch (format_type) {
    case kNormal:
      return bip32_;
    case kBip49:
      return bip49_;
    case kBip84:
      return bip84_;
    default:
      throw CfdException(
          CfdError::kCfdOutOfRangeError, "unknown format type.");
  }
}